

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlregexp.c
# Opt level: O0

void xmlFAGenerateCountedTransition
               (xmlRegParserCtxtPtr ctxt,xmlRegStatePtr from,xmlRegStatePtr to,int counter)

{
  xmlRegStatePtr pxStack_20;
  int counter_local;
  xmlRegStatePtr to_local;
  xmlRegStatePtr from_local;
  xmlRegParserCtxtPtr ctxt_local;
  
  pxStack_20 = to;
  if (to == (xmlRegStatePtr)0x0) {
    pxStack_20 = xmlRegNewState(ctxt);
    xmlRegStatePush(ctxt,pxStack_20);
    ctxt->state = pxStack_20;
  }
  xmlRegStateAddTrans(ctxt,from,(xmlRegAtomPtr)0x0,pxStack_20,-1,counter);
  return;
}

Assistant:

static void
xmlFAGenerateCountedTransition(xmlRegParserCtxtPtr ctxt,
	    xmlRegStatePtr from, xmlRegStatePtr to, int counter) {
    if (to == NULL) {
	to = xmlRegNewState(ctxt);
	xmlRegStatePush(ctxt, to);
	ctxt->state = to;
    }
    xmlRegStateAddTrans(ctxt, from, NULL, to, -1, counter);
}